

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O1

int png_image_write_to_stdio
              (png_imagep image,FILE *file,int convert_to_8bit,void *buffer,png_int_32 row_stride,
              void *colormap)

{
  int iVar1;
  char *error_message;
  png_image_write_control display;
  png_imagep local_88;
  void *pvStack_80;
  ulong local_78;
  void *pvStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (image == (png_imagep)0x0) {
    return 0;
  }
  if (image->version == 1) {
    if (buffer != (void *)0x0 && file != (FILE *)0x0) {
      iVar1 = png_image_write_init(image);
      if (iVar1 == 0) {
        return 0;
      }
      image->opaque->png_ptr->io_ptr = file;
      uStack_60 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_38 = 0;
      local_78 = (ulong)(uint)row_stride;
      local_68 = (ulong)(uint)convert_to_8bit;
      local_88 = image;
      pvStack_80 = buffer;
      pvStack_70 = colormap;
      iVar1 = png_safe_execute(image,png_image_write_main,&local_88);
      png_image_free(image);
      return iVar1;
    }
    error_message = "png_image_write_to_stdio: invalid argument";
  }
  else {
    error_message = "png_image_write_to_stdio: incorrect PNG_IMAGE_VERSION";
  }
  iVar1 = png_image_error(image,error_message);
  return iVar1;
}

Assistant:

int PNGAPI
png_image_write_to_stdio(png_imagep image, FILE *file, int convert_to_8bit,
    const void *buffer, png_int_32 row_stride, const void *colormap)
{
   /* Write the image to the given (FILE*). */
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (file != NULL && buffer != NULL)
      {
         if (png_image_write_init(image) != 0)
         {
            png_image_write_control display;
            int result;

            /* This is slightly evil, but png_init_io doesn't do anything other
             * than this and we haven't changed the standard IO functions so
             * this saves a 'safe' function.
             */
            image->opaque->png_ptr->io_ptr = file;

            memset(&display, 0, (sizeof display));
            display.image = image;
            display.buffer = buffer;
            display.row_stride = row_stride;
            display.colormap = colormap;
            display.convert_to_8bit = convert_to_8bit;

            result = png_safe_execute(image, png_image_write_main, &display);
            png_image_free(image);
            return result;
         }

         else
            return 0;
      }

      else
         return png_image_error(image,
             "png_image_write_to_stdio: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_write_to_stdio: incorrect PNG_IMAGE_VERSION");

   else
      return 0;
}